

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O2

bool CoreML::Specification::operator==(NeuralNetworkPreprocessing *a,NeuralNetworkPreprocessing *b)

{
  uint32 uVar1;
  bool bVar2;
  NeuralNetworkMeanImage *a_00;
  NeuralNetworkMeanImage *b_00;
  NeuralNetworkImageScaler *a_01;
  NeuralNetworkImageScaler *b_01;
  
  bVar2 = std::operator!=((a->featurename_).ptr_,(b->featurename_).ptr_);
  if (((!bVar2) && (uVar1 = a->_oneof_case_[0], uVar1 == b->_oneof_case_[0])) && (uVar1 != 0)) {
    if (uVar1 == 0xb) {
      a_00 = NeuralNetworkPreprocessing::meanimage(a);
      b_00 = NeuralNetworkPreprocessing::meanimage(b);
      bVar2 = operator==(a_00,b_00);
      return bVar2;
    }
    a_01 = NeuralNetworkPreprocessing::scaler(a);
    b_01 = NeuralNetworkPreprocessing::scaler(b);
    bVar2 = operator==(a_01,b_01);
    return bVar2;
  }
  return false;
}

Assistant:

bool operator==(const NeuralNetworkPreprocessing& a,
                        const NeuralNetworkPreprocessing& b) {
            if (a.featurename() != b.featurename()) {
                return false;
            }
            if (a.preprocessor_case() != b.preprocessor_case()) {
                return false;
            }
            switch (a.preprocessor_case()) {
                case NeuralNetworkPreprocessing::kScaler:
                    return a.scaler() == b.scaler();
                case NeuralNetworkPreprocessing::kMeanImage:
                    return a.meanimage() == b.meanimage();
                case NeuralNetworkPreprocessing::PREPROCESSOR_NOT_SET:
                    return false;
            }
        }